

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  u8 *puVar1;
  Fts5Config *pConfig;
  u8 *puVar2;
  sqlite3_stmt *pStmt;
  int iVar3;
  i64 iVar4;
  Fts5Data *p_00;
  char *pcVar5;
  uchar *zLeft;
  sqlite3_value *pMem;
  Fts5Structure *pFVar6;
  int local_58;
  int local_54;
  i64 local_50;
  Fts5Structure *local_48;
  sqlite3_stmt *p_1;
  int local_34;
  
  if (p->pStruct != (Fts5Structure *)0x0) goto LAB_001a085b;
  iVar4 = fts5IndexDataVersion(p);
  p->iStructVersion = iVar4;
  if (p->rc != 0) goto LAB_001a085b;
  local_48 = (Fts5Structure *)0x0;
  pConfig = p->pConfig;
  p_00 = fts5DataRead(p,10);
  if (p->rc == 0) {
    puVar2 = p_00->p;
    iVar3 = p_00->nn;
    puVar1 = puVar2 + (long)iVar3 + 0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar2 = puVar2 + iVar3;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\0';
    puVar2[0xc] = '\0';
    puVar2[0xd] = '\0';
    puVar2[0xe] = '\0';
    puVar2[0xf] = '\0';
    iVar3 = fts5StructureDecode(p_00->p,p_00->nn,&local_58,&local_48);
    p->rc = iVar3;
    if ((iVar3 == 0) && (pConfig->iCookie != local_58)) {
      p_1 = (sqlite3_stmt *)0x0;
      local_54 = 0;
      pConfig->pgsz = 0xfd2;
      pConfig->nAutomerge = 4;
      pConfig->nCrisisMerge = 0x10;
      pConfig->nUsermerge = 4;
      pConfig->nHashSize = 0x100000;
      pcVar5 = sqlite3Fts5Mprintf(&local_54,"SELECT k, v FROM %Q.\'%q_config\'",pConfig->zDb,
                                  pConfig->zName);
      iVar3 = local_54;
      if (pcVar5 != (char *)0x0) {
        iVar3 = sqlite3_prepare_v2(pConfig->db,pcVar5,-1,&p_1,(char **)0x0);
        sqlite3_free(pcVar5);
      }
      pStmt = p_1;
      if (iVar3 == 0) {
        local_50 = 0;
        while (iVar3 = sqlite3_step(pStmt), iVar3 == 100) {
          zLeft = sqlite3_column_text(pStmt,0);
          pMem = sqlite3_column_value(pStmt,1);
          iVar3 = sqlite3_stricmp((char *)zLeft,"version");
          if (iVar3 == 0) {
            local_50 = sqlite3VdbeIntValue(pMem);
          }
          else {
            sqlite3Fts5ConfigSetValue(pConfig,(char *)zLeft,pMem,&local_34);
          }
        }
        iVar3 = sqlite3_finalize(pStmt);
        if ((int)local_50 == 4 || iVar3 != 0) {
          if (iVar3 == 0) {
            pConfig->iCookie = local_58;
            iVar3 = 0;
          }
        }
        else {
          if (pConfig->pzErrmsg != (char **)0x0) {
            pcVar5 = sqlite3_mprintf("invalid fts5 file format (found %d, expected %d) - run \'rebuild\'"
                                     ,local_50,4);
            *pConfig->pzErrmsg = pcVar5;
          }
          iVar3 = 1;
        }
      }
      p->rc = iVar3;
    }
    sqlite3_free(p_00);
    if (p->rc != 0) {
      fts5StructureRelease(local_48);
      goto LAB_001a0852;
    }
  }
  else {
LAB_001a0852:
    local_48 = (Fts5Structure *)0x0;
  }
  p->pStruct = local_48;
LAB_001a085b:
  if (p->rc == 0) {
    pFVar6 = p->pStruct;
    pFVar6->nRef = pFVar6->nRef + 1;
  }
  else {
    pFVar6 = (Fts5Structure *)0x0;
  }
  return pFVar6;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}